

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O0

spv_result_t spvtools::val::RayQueryPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  Op OVar2;
  spv_result_t sVar3;
  uint32_t uVar4;
  DiagnosticStream *pDVar5;
  DiagnosticStream local_1e38;
  DiagnosticStream local_1c60;
  DiagnosticStream local_1a88;
  uint32_t local_18b0 [2];
  uint32_t component_type;
  uint32_t col_type;
  uint32_t num_cols;
  uint32_t num_rows;
  spv_result_t error_14;
  spv_result_t error_13;
  spv_result_t local_16bc;
  spv_result_t local_16b8;
  spv_result_t error_12;
  spv_result_t error_11;
  spv_result_t error_10;
  spv_result_t local_14d8;
  spv_result_t error_9;
  spv_result_t error_8;
  spv_result_t local_12f8;
  spv_result_t error_7;
  spv_result_t error_6;
  spv_result_t local_1118;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t local_f34;
  undefined1 local_f30 [4];
  spv_result_t error_3;
  uint32_t local_d54;
  spv_result_t local_d50;
  uint32_t hit_t_id;
  spv_result_t error_2;
  spv_result_t error_1;
  uint32_t local_b6c;
  undefined1 local_b68 [4];
  uint32_t ray_tmax;
  uint32_t local_98c;
  undefined1 local_988 [4];
  uint32_t ray_direction;
  uint32_t local_7ac;
  undefined1 local_7a8 [4];
  uint32_t ray_tmin;
  uint32_t local_5cc;
  undefined1 local_5c8 [4];
  uint32_t ray_origin;
  uint32_t local_3ec;
  undefined1 local_3e8 [4];
  uint32_t cull_mask;
  uint32_t local_20c;
  undefined1 local_208 [4];
  uint32_t ray_flags;
  spv_result_t local_2c;
  uint32_t local_28;
  spv_result_t error;
  uint32_t result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _result_type = inst;
  inst_local = (Instruction *)_;
  error = Instruction::opcode(inst);
  local_28 = Instruction::type_id(_result_type);
  if (error == 0x1179) {
    local_2c = anon_unknown_2::ValidateRayQueryPointer
                         ((ValidationState_t *)inst_local,_result_type,0);
    this = inst_local;
    if (local_2c != SPV_SUCCESS) {
      return local_2c;
    }
    uVar4 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,1);
    OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)this,uVar4);
    if (OVar2 != OpTypeAccelerationStructureKHR) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_208,
                          (char (*) [77])
                          "Expected Acceleration Structure to be of type OpTypeAccelerationStructureKHR"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return __local._4_4_;
    }
    local_20c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,2);
    bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_20c);
    if ((!bVar1) ||
       (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_20c),
       uVar4 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3e8,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_3e8,
                          (char (*) [38])"Ray Flags must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e8);
      return __local._4_4_;
    }
    local_3ec = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,3);
    bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_3ec);
    if ((bVar1) &&
       (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_3ec),
       uVar4 == 0x20)) {
      local_5cc = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,4);
      bVar1 = ValidationState_t::IsFloatVectorType((ValidationState_t *)inst_local,local_5cc);
      if (((!bVar1) ||
          (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_5cc),
          uVar4 != 3)) ||
         (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_5cc),
         uVar4 != 0x20)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_7a8,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar5 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_7a8,
                            (char (*) [53])"Ray Origin must be a 32-bit float 3-component vector");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7a8);
        return __local._4_4_;
      }
      local_7ac = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,5);
      bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_7ac);
      if ((!bVar1) ||
         (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_7ac),
         uVar4 != 0x20)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_988,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar5 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_988,
                            (char (*) [39])"Ray TMin must be a 32-bit float scalar");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_988);
        return __local._4_4_;
      }
      local_98c = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,6);
      bVar1 = ValidationState_t::IsFloatVectorType((ValidationState_t *)inst_local,local_98c);
      if (((bVar1) &&
          (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_98c),
          uVar4 == 3)) &&
         (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_98c),
         uVar4 == 0x20)) {
        local_b6c = ValidationState_t::GetOperandTypeId
                              ((ValidationState_t *)inst_local,_result_type,7);
        bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_b6c);
        if ((bVar1) &&
           (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_b6c),
           uVar4 == 0x20)) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&error_2,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar5 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&error_2,
                            (char (*) [39])"Ray TMax must be a 32-bit float scalar");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_2);
        return __local._4_4_;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)local_b68,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_b68,
                          (char (*) [56])"Ray Direction must be a 32-bit float 3-component vector");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_b68);
      return __local._4_4_;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)local_5c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               _result_type);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_5c8,
                        (char (*) [38])"Cull Mask must be a 32-bit int scalar");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5c8);
    return __local._4_4_;
  }
  if (error != 0x117a) {
    if (error == 0x117b) {
      local_d50 = anon_unknown_2::ValidateRayQueryPointer
                            ((ValidationState_t *)inst_local,_result_type,0);
      if (local_d50 != SPV_SUCCESS) {
        return local_d50;
      }
      local_d54 = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,1);
      bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_d54);
      if ((bVar1) &&
         (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_d54),
         uVar4 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)local_f30,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_f30,
                          (char (*) [36])"Hit T must be a 32-bit float scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_f30);
      return __local._4_4_;
    }
    if (error != 0x117c) {
      if (error == 0x117d) {
LAB_00598ee2:
        local_f34 = anon_unknown_2::ValidateRayQueryPointer
                              ((ValidationState_t *)inst_local,_result_type,2);
        if (local_f34 != SPV_SUCCESS) {
          return local_f34;
        }
        bVar1 = ValidationState_t::IsBoolScalarType((ValidationState_t *)inst_local,local_28);
        if (!bVar1) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&error_5,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_DATA,_result_type);
          pDVar5 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&error_5,(char (*) [44])0x61e0c6);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_5);
          return __local._4_4_;
        }
        if (error != 0x1789) {
          return SPV_SUCCESS;
        }
        sVar3 = anon_unknown_2::ValidateIntersectionId
                          ((ValidationState_t *)inst_local,_result_type,3);
        goto joined_r0x00599236;
      }
      if (error != 0x117f) {
        if (error == 0x1780) {
LAB_00598fa8:
          local_1118 = anon_unknown_2::ValidateRayQueryPointer
                                 ((ValidationState_t *)inst_local,_result_type,2);
          if (local_1118 != SPV_SUCCESS) {
            return local_1118;
          }
          bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_28);
          if ((!bVar1) ||
             (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28),
             uVar4 != 0x20)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&error_7,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,_result_type);
            pDVar5 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)&error_7,
                                (char (*) [52])"expected Result Type to be 32-bit float scalar type"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_7);
            return __local._4_4_;
          }
          if (error != 0x1782) {
            return SPV_SUCCESS;
          }
          sVar3 = anon_unknown_2::ValidateIntersectionId
                            ((ValidationState_t *)inst_local,_result_type,3);
          goto joined_r0x00599236;
        }
        if (error != 0x1781) {
          if (error == 0x1782) goto LAB_00598fa8;
          if (4 < (uint)(error + 0xffffe87d)) {
            if (error == 0x1788) {
              local_16b8 = anon_unknown_2::ValidateRayQueryPointer
                                     ((ValidationState_t *)inst_local,_result_type,2);
              if (local_16b8 != SPV_SUCCESS) {
                return local_16b8;
              }
              local_16bc = anon_unknown_2::ValidateIntersectionId
                                     ((ValidationState_t *)inst_local,_result_type,3);
              if (local_16bc == SPV_SUCCESS) {
                bVar1 = ValidationState_t::IsFloatVectorType
                                  ((ValidationState_t *)inst_local,local_28);
                if (((bVar1) &&
                    (uVar4 = ValidationState_t::GetDimension
                                       ((ValidationState_t *)inst_local,local_28), uVar4 == 2)) &&
                   (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28)
                   , uVar4 == 0x20)) {
                  return SPV_SUCCESS;
                }
                ValidationState_t::diag
                          ((DiagnosticStream *)&error_14,(ValidationState_t *)inst_local,
                           SPV_ERROR_INVALID_DATA,_result_type);
                pDVar5 = DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&error_14,
                                    (char (*) [64])
                                    "expected Result Type to be 32-bit float 2-component vector type"
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_14);
                return __local._4_4_;
              }
              return local_16bc;
            }
            if (1 < (uint)(error + 0xffffe877)) {
              if (3 < (uint)(error + 0xffffe875)) {
                if (1 < (uint)(error + 0xffffe871)) {
                  return SPV_SUCCESS;
                }
                num_rows = anon_unknown_2::ValidateRayQueryPointer
                                     ((ValidationState_t *)inst_local,_result_type,2);
                if (num_rows != SPV_SUCCESS) {
                  return num_rows;
                }
                num_cols = anon_unknown_2::ValidateIntersectionId
                                     ((ValidationState_t *)inst_local,_result_type,3);
                if (num_cols != SPV_SUCCESS) {
                  return num_cols;
                }
                col_type = 0;
                component_type = 0;
                local_18b0[1] = 0;
                local_18b0[0] = 0;
                bVar1 = ValidationState_t::GetMatrixTypeInfo
                                  ((ValidationState_t *)inst_local,local_28,&col_type,
                                   &component_type,local_18b0 + 1,local_18b0);
                if (bVar1) {
                  if (component_type != 4) {
                    ValidationState_t::diag
                              (&local_1c60,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                               _result_type);
                    pDVar5 = DiagnosticStream::operator<<
                                       (&local_1c60,
                                        (char (*) [56])
                                        "expected Result Type matrix to have a Column Count of 4");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                    DiagnosticStream::~DiagnosticStream(&local_1c60);
                    return __local._4_4_;
                  }
                  bVar1 = ValidationState_t::IsFloatScalarType
                                    ((ValidationState_t *)inst_local,local_18b0[0]);
                  if (((bVar1) &&
                      (uVar4 = ValidationState_t::GetBitWidth
                                         ((ValidationState_t *)inst_local,local_28), uVar4 == 0x20))
                     && (col_type == 3)) {
                    return SPV_SUCCESS;
                  }
                  ValidationState_t::diag
                            (&local_1e38,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                             _result_type);
                  pDVar5 = DiagnosticStream::operator<<
                                     (&local_1e38,
                                      (char (*) [86])
                                      "expected Result Type matrix to have a Column Type of 3-component 32-bit float vectors"
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                  DiagnosticStream::~DiagnosticStream(&local_1e38);
                  return __local._4_4_;
                }
                ValidationState_t::diag
                          (&local_1a88,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _result_type);
                pDVar5 = DiagnosticStream::operator<<
                                   (&local_1a88,(char (*) [36])"expected matrix type as Result Type"
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                DiagnosticStream::~DiagnosticStream(&local_1a88);
                return __local._4_4_;
              }
              local_14d8 = anon_unknown_2::ValidateRayQueryPointer
                                     ((ValidationState_t *)inst_local,_result_type,2);
              if (local_14d8 != SPV_SUCCESS) {
                return local_14d8;
              }
              bVar1 = ValidationState_t::IsFloatVectorType((ValidationState_t *)inst_local,local_28)
              ;
              if (((!bVar1) ||
                  (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_28)
                  , uVar4 != 3)) ||
                 (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28),
                 uVar4 != 0x20)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&error_11,(ValidationState_t *)inst_local,
                           SPV_ERROR_INVALID_DATA,_result_type);
                pDVar5 = DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&error_11,
                                    (char (*) [64])
                                    "expected Result Type to be 32-bit float 3-component vector type"
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_11);
                return __local._4_4_;
              }
              if ((error != 0x178b) && (error != 0x178c)) {
                return SPV_SUCCESS;
              }
              sVar3 = anon_unknown_2::ValidateIntersectionId
                                ((ValidationState_t *)inst_local,_result_type,3);
              goto joined_r0x00599236;
            }
            goto LAB_00598ee2;
          }
        }
      }
      local_12f8 = anon_unknown_2::ValidateRayQueryPointer
                             ((ValidationState_t *)inst_local,_result_type,2);
      if (local_12f8 != SPV_SUCCESS) {
        return local_12f8;
      }
      bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_28);
      if ((!bVar1) ||
         (uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28),
         uVar4 != 0x20)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&error_9,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,_result_type);
        pDVar5 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&error_9,
                            (char (*) [50])"expected Result Type to be 32-bit int scalar type");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_9);
        return __local._4_4_;
      }
      if (error == 0x1781) {
        return SPV_SUCCESS;
      }
      sVar3 = anon_unknown_2::ValidateIntersectionId((ValidationState_t *)inst_local,_result_type,3)
      ;
      goto joined_r0x00599236;
    }
  }
  sVar3 = anon_unknown_2::ValidateRayQueryPointer((ValidationState_t *)inst_local,_result_type,0);
joined_r0x00599236:
  if (sVar3 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar3;
}

Assistant:

spv_result_t RayQueryPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpRayQueryInitializeKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 0)) return error;

      if (_.GetIdOpcode(_.GetOperandTypeId(inst, 1)) !=
          spv::Op::OpTypeAccelerationStructureKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Acceleration Structure to be of type "
                  "OpTypeAccelerationStructureKHR";
      }

      const uint32_t ray_flags = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(ray_flags) || _.GetBitWidth(ray_flags) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Flags must be a 32-bit int scalar";
      }

      const uint32_t cull_mask = _.GetOperandTypeId(inst, 3);
      if (!_.IsIntScalarType(cull_mask) || _.GetBitWidth(cull_mask) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Cull Mask must be a 32-bit int scalar";
      }

      const uint32_t ray_origin = _.GetOperandTypeId(inst, 4);
      if (!_.IsFloatVectorType(ray_origin) || _.GetDimension(ray_origin) != 3 ||
          _.GetBitWidth(ray_origin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Origin must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmin = _.GetOperandTypeId(inst, 5);
      if (!_.IsFloatScalarType(ray_tmin) || _.GetBitWidth(ray_tmin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMin must be a 32-bit float scalar";
      }

      const uint32_t ray_direction = _.GetOperandTypeId(inst, 6);
      if (!_.IsFloatVectorType(ray_direction) ||
          _.GetDimension(ray_direction) != 3 ||
          _.GetBitWidth(ray_direction) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Direction must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmax = _.GetOperandTypeId(inst, 7);
      if (!_.IsFloatScalarType(ray_tmax) || _.GetBitWidth(ray_tmax) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMax must be a 32-bit float scalar";
      }
      break;
    }

    case spv::Op::OpRayQueryTerminateKHR:
    case spv::Op::OpRayQueryConfirmIntersectionKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 0)) return error;
      break;
    }

    case spv::Op::OpRayQueryGenerateIntersectionKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 0)) return error;

      const uint32_t hit_t_id = _.GetOperandTypeId(inst, 1);
      if (!_.IsFloatScalarType(hit_t_id) || _.GetBitWidth(hit_t_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit T must be a 32-bit float scalar";
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionFrontFaceKHR:
    case spv::Op::OpRayQueryProceedKHR:
    case spv::Op::OpRayQueryGetIntersectionCandidateAABBOpaqueKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be bool scalar type";
      }

      if (opcode == spv::Op::OpRayQueryGetIntersectionFrontFaceKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionTKHR:
    case spv::Op::OpRayQueryGetRayTMinKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsFloatScalarType(result_type) ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float scalar type";
      }

      if (opcode == spv::Op::OpRayQueryGetIntersectionTKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionTypeKHR:
    case spv::Op::OpRayQueryGetIntersectionInstanceCustomIndexKHR:
    case spv::Op::OpRayQueryGetIntersectionInstanceIdKHR:
    case spv::Op::
        OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
    case spv::Op::OpRayQueryGetIntersectionGeometryIndexKHR:
    case spv::Op::OpRayQueryGetIntersectionPrimitiveIndexKHR:
    case spv::Op::OpRayQueryGetRayFlagsKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsIntScalarType(result_type) || _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit int scalar type";
      }

      if (opcode != spv::Op::OpRayQueryGetRayFlagsKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionObjectRayDirectionKHR:
    case spv::Op::OpRayQueryGetIntersectionObjectRayOriginKHR:
    case spv::Op::OpRayQueryGetWorldRayDirectionKHR:
    case spv::Op::OpRayQueryGetWorldRayOriginKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 3 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float 3-component "
                  "vector type";
      }

      if (opcode == spv::Op::OpRayQueryGetIntersectionObjectRayDirectionKHR ||
          opcode == spv::Op::OpRayQueryGetIntersectionObjectRayOriginKHR) {
        if (auto error = ValidateIntersectionId(_, inst, 3)) return error;
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionBarycentricsKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 2 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be 32-bit float 2-component "
                  "vector type";
      }

      break;
    }

    case spv::Op::OpRayQueryGetIntersectionObjectToWorldKHR:
    case spv::Op::OpRayQueryGetIntersectionWorldToObjectKHR: {
      if (auto error = ValidateRayQueryPointer(_, inst, 2)) return error;
      if (auto error = ValidateIntersectionId(_, inst, 3)) return error;

      uint32_t num_rows = 0;
      uint32_t num_cols = 0;
      uint32_t col_type = 0;
      uint32_t component_type = 0;
      if (!_.GetMatrixTypeInfo(result_type, &num_rows, &num_cols, &col_type,
                               &component_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected matrix type as Result Type";
      }

      if (num_cols != 4) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Count of 4";
      }

      if (!_.IsFloatScalarType(component_type) ||
          _.GetBitWidth(result_type) != 32 || num_rows != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Type of "
                  "3-component 32-bit float vectors";
      }
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}